

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O0

Int128 Omega_h::
       transform_reduce<Omega_h::IntIterator,Omega_h::int128_sum(Omega_h::Read<double>,double)::__0,Omega_h::Int128,Omega_h::Int128Plus>
                 (int first,int last,long param_3,int64_t param_4,type *param_5)

{
  ulong uVar1;
  Int128 IVar2;
  __0 local_108 [8];
  type transform_local;
  type *transform_local_1;
  long lStack_e0;
  Int128 init_local;
  IntIterator last_local;
  IntIterator first_local;
  Int128 sum;
  
  entering_parallel = 1;
  transform_local.unit = (double)param_5;
  int128_sum(Omega_h::Read<double>,double)::$_0::__0(local_108,param_5);
  entering_parallel = 0;
  lStack_e0 = param_3;
  init_local.high = param_4;
  init_local.low._4_4_ = first;
  while( true ) {
    if (init_local.low._4_4_ == last) break;
    IVar2 = std::
            remove_reference<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp:526:20)_&>
            ::type::operator()(local_108,init_local.low._4_4_);
    uVar1 = init_local.high + IVar2.low;
    lStack_e0 = lStack_e0 + IVar2.high + (ulong)(uVar1 < (ulong)init_local.high);
    init_local.low._4_4_ = init_local.low._4_4_ + 1;
    init_local.high = uVar1;
  }
  int128_sum(Omega_h::Read<double>,double)::$_0::~__0(local_108);
  IVar2.low = init_local.high;
  IVar2.high = lStack_e0;
  return IVar2;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}